

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O2

void __thiscall kratos::ExtractDebugVisitor::visit(ExtractDebugVisitor *this,ScopedStmtBlock *stmt)

{
  process_stmt(this,(Stmt *)stmt);
  return;
}

Assistant:

void visit(ScopedStmtBlock *stmt) override { process_stmt(stmt); }